

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DebugDrawItemRect(ImU32 col)

{
  ImGuiWindow *window;
  ImGuiContext *g;
  float in_stack_00000070;
  ImDrawFlags in_stack_00000074;
  float in_stack_00000078;
  ImU32 in_stack_0000007c;
  ImVec2 *in_stack_00000080;
  ImVec2 *in_stack_00000088;
  ImDrawList *in_stack_00000090;
  
  GetForegroundDrawList((ImGuiWindow *)0x20bd8d);
  ImDrawList::AddRect(in_stack_00000090,in_stack_00000088,in_stack_00000080,in_stack_0000007c,
                      in_stack_00000078,in_stack_00000074,in_stack_00000070);
  return;
}

Assistant:

void ImGui::DebugDrawItemRect(ImU32 col)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    GetForegroundDrawList(window)->AddRect(g.LastItemData.Rect.Min, g.LastItemData.Rect.Max, col);
}